

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O0

void __thiscall
HawkTracer::parser::KlassRegister::_add_klass_field
          (KlassRegister *this,HT_EventKlassId klass_id,
          unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
          *field)

{
  __shared_ptr_access<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *this_01;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  local_40 [3];
  lock_guard<std::mutex> local_28;
  lock_guard l;
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  *field_local;
  KlassRegister *pKStack_10;
  HT_EventKlassId klass_id_local;
  KlassRegister *this_local;
  
  l._M_device = (mutex_type *)field;
  field_local._4_4_ = klass_id;
  pKStack_10 = this;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->_register_mtx);
  this_00 = (__shared_ptr_access<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
               ::at(&this->_register,(key_type *)((long)&field_local + 4));
  this_01 = std::
            __shared_ptr_access<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(this_00);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::unique_ptr(local_40,field);
  EventKlass::add_field(this_01,local_40);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
  ::~unique_ptr(local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void KlassRegister::_add_klass_field(HT_EventKlassId klass_id, std::unique_ptr<EventKlassField> field)
{
    lock_guard l(_register_mtx);
    _register.at(klass_id)->add_field(std::move(field));
}